

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

void llvm::report_fatal_error(Error *Err,bool GenCrashDiag)

{
  Twine ErrorBanner;
  bool bVar1;
  Child local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  Error local_80 [3];
  undefined1 local_68 [8];
  raw_string_ostream ErrStream;
  string ErrMsg;
  bool GenCrashDiag_local;
  Error *Err_local;
  
  bVar1 = Error::operator_cast_to_bool(Err);
  if (!bVar1) {
    __assert_fail("Err && \"report_fatal_error called with success value\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/Error.cpp"
                  ,0x8b,"void llvm::report_fatal_error(Error, bool)");
  }
  std::__cxx11::string::string((string *)&ErrStream.OS);
  raw_string_ostream::raw_string_ostream((raw_string_ostream *)local_68,(string *)&ErrStream.OS);
  Error::Error(local_80,Err);
  Twine::Twine((Twine *)&local_98);
  ErrorBanner.RHS = (Child)uStack_90;
  ErrorBanner.LHS.twine = local_98.twine;
  ErrorBanner.LHSKind = (undefined1)local_88;
  ErrorBanner.RHSKind = local_88._1_1_;
  ErrorBanner._18_6_ = local_88._2_6_;
  logAllUnhandledErrors(local_80,(raw_ostream *)local_68,ErrorBanner);
  Error::~Error(local_80);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_68);
  report_fatal_error((string *)&ErrStream.OS,true);
}

Assistant:

void report_fatal_error(Error Err, bool GenCrashDiag) {
  assert(Err && "report_fatal_error called with success value");
  std::string ErrMsg;
  {
    raw_string_ostream ErrStream(ErrMsg);
    logAllUnhandledErrors(std::move(Err), ErrStream);
  }
  report_fatal_error(ErrMsg);
}